

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidatePushElement(xmlValidCtxtPtr ctxt,xmlDocPtr doc,xmlNodePtr elem,xmlChar *qname)

{
  uint uVar1;
  xmlElementPtr pxVar2;
  _xmlElementContent *p_Var3;
  int iVar4;
  xmlNodePtr pxVar5;
  xmlValidState *pxVar6;
  xmlRegExecCtxtPtr pxVar7;
  char *pcVar8;
  xmlParserErrors xVar9;
  uint uVar10;
  uint uVar11;
  xmlChar *pxVar12;
  xmlValidCtxtPtr pxVar13;
  xmlRegexpPtr comp;
  xmlChar *str1;
  xmlElementContentPtr pxVar14;
  int iVar15;
  int local_40;
  int extsubset;
  xmlChar *local_38;
  
  extsubset = 0;
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    return 0;
  }
  iVar15 = 1;
  if (((ctxt->vstateNr < 1) || (pxVar6 = ctxt->vstate, pxVar6 == (xmlValidState *)0x0)) ||
     (pxVar2 = pxVar6->elemDecl, pxVar2 == (xmlElementPtr)0x0)) goto switchD_00153e0d_caseD_2;
  switch(pxVar2->etype) {
  case XML_ELEMENT_TYPE_UNDEFINED:
    goto switchD_00153e0d_caseD_0;
  case XML_ELEMENT_TYPE_EMPTY:
    pxVar5 = pxVar6->node;
    pxVar12 = pxVar5->name;
    pcVar8 = "Element %s was declared EMPTY this one has content\n";
    xVar9 = XML_DTD_NOT_EMPTY;
    goto LAB_00153e5f;
  case XML_ELEMENT_TYPE_MIXED:
    pxVar14 = pxVar2->content;
    if ((pxVar14 == (xmlElementContentPtr)0x0) || (pxVar14->type != XML_ELEMENT_CONTENT_PCDATA)) {
      local_38 = xmlSplitQName3(qname,&local_40);
      if (local_38 == (xmlChar *)0x0) {
        for (; pxVar14 != (xmlElementContentPtr)0x0; pxVar14 = pxVar14->c2) {
          if (pxVar14->type == XML_ELEMENT_CONTENT_OR) {
            p_Var3 = pxVar14->c1;
            if (p_Var3 == (_xmlElementContent *)0x0) goto LAB_00153fd4;
            if (p_Var3->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var3->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00153fd4;
              if (p_Var3->prefix == (xmlChar *)0x0) {
                pxVar12 = p_Var3->name;
                goto LAB_00153f91;
              }
            }
          }
          else {
            if (pxVar14->type != XML_ELEMENT_CONTENT_ELEMENT) {
LAB_00153fd4:
              pxVar13 = (xmlValidCtxtPtr)0x0;
              goto LAB_00153fd6;
            }
            if (pxVar14->prefix == (xmlChar *)0x0) {
              pxVar12 = pxVar14->name;
LAB_00153f91:
              iVar4 = xmlStrEqual(pxVar12,qname);
              if (iVar4 == 0) goto LAB_00153f9f;
              goto switchD_00153e0d_caseD_2;
            }
          }
LAB_00153f9f:
        }
      }
      else {
        for (; pxVar14 != (xmlElementContentPtr)0x0; pxVar14 = pxVar14->c2) {
          pxVar13 = ctxt;
          if (pxVar14->type == XML_ELEMENT_CONTENT_OR) {
            p_Var3 = pxVar14->c1;
            if (p_Var3 == (_xmlElementContent *)0x0) goto LAB_00153fd6;
            if (p_Var3->type != XML_ELEMENT_CONTENT_PCDATA) {
              if (p_Var3->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00153fd6;
              if ((p_Var3->prefix != (xmlChar *)0x0) &&
                 (iVar4 = xmlStrncmp(p_Var3->prefix,qname,local_40), iVar4 == 0)) {
                pxVar12 = pxVar14->c1->name;
                goto LAB_00153f3b;
              }
            }
          }
          else {
            if (pxVar14->type != XML_ELEMENT_CONTENT_ELEMENT) goto LAB_00153fd6;
            if ((pxVar14->prefix != (xmlChar *)0x0) &&
               (iVar4 = xmlStrncmp(pxVar14->prefix,qname,local_40), iVar4 == 0)) {
              pxVar12 = pxVar14->name;
LAB_00153f3b:
              iVar4 = xmlStrEqual(pxVar12,local_38);
              if (iVar4 != 0) goto switchD_00153e0d_caseD_2;
            }
          }
        }
      }
      goto LAB_00153fe9;
    }
    pxVar5 = pxVar6->node;
    pxVar12 = pxVar5->name;
    pcVar8 = "Element %s was declared #PCDATA but contains non text nodes\n";
    xVar9 = XML_DTD_NOT_PCDATA;
LAB_00153e5f:
    iVar15 = 0;
    xmlErrValidNode(ctxt,pxVar5,xVar9,pcVar8,pxVar12,(xmlChar *)0x0,(xmlChar *)0x0);
    break;
  case XML_ELEMENT_TYPE_ELEMENT:
    if (pxVar6->exec != (xmlRegExecCtxtPtr)0x0) {
      iVar4 = xmlRegExecPushString(pxVar6->exec,qname,(void *)0x0);
      if (iVar4 == -5) {
        xmlVErrMemory(ctxt);
        return 0;
      }
      if (iVar4 < 0) {
        pxVar5 = pxVar6->node;
        pcVar8 = "Element %s content does not follow the DTD, Misplaced %s\n";
        xVar9 = XML_DTD_CONTENT_MODEL;
        str1 = pxVar5->name;
        pxVar12 = qname;
        goto LAB_0015400a;
      }
    }
  }
switchD_00153e0d_caseD_2:
  pxVar5 = (xmlNodePtr)xmlValidGetElemDecl(ctxt,doc,elem,&extsubset);
  iVar4 = ctxt->vstateNr;
  uVar1 = ctxt->vstateMax;
  if (iVar4 < (int)uVar1) {
    pxVar6 = ctxt->vstateTab;
LAB_00154086:
    ctxt->vstate = pxVar6 + iVar4;
    pxVar6[iVar4].elemDecl = (xmlElementPtr)pxVar5;
    pxVar6[iVar4].node = elem;
    if ((pxVar5 != (xmlNodePtr)0x0) && (*(int *)&pxVar5->ns == 4)) {
      comp = (xmlRegexpPtr)pxVar5->psvi;
      if (comp == (xmlRegexpPtr)0x0) {
        xmlValidBuildContentModel(ctxt,(xmlElementPtr)pxVar5);
        comp = (xmlRegexpPtr)pxVar5->psvi;
        if (comp == (xmlRegexpPtr)0x0) {
          ctxt->vstateTab[ctxt->vstateNr].exec = (xmlRegExecCtxtPtr)0x0;
          xmlErrValidNode(ctxt,pxVar5,XML_ERR_INTERNAL_ERROR,
                          "Failed to build content model regexp for %s\n",elem->name,(xmlChar *)0x0,
                          (xmlChar *)0x0);
          iVar4 = ctxt->vstateNr;
          goto LAB_0015412d;
        }
      }
      pxVar7 = xmlRegNewExecCtxt(comp,(xmlRegExecCallbacks)0x0,(void *)0x0);
      iVar4 = ctxt->vstateNr;
      ctxt->vstateTab[iVar4].exec = pxVar7;
      if (pxVar7 == (xmlRegExecCtxtPtr)0x0) goto LAB_001540ed;
    }
LAB_0015412d:
    ctxt->vstateNr = iVar4 + 1;
  }
  else {
    if ((int)uVar1 < 1) {
      uVar11 = 10;
LAB_00154064:
      pxVar6 = (xmlValidState *)(*xmlRealloc)(ctxt->vstateTab,(ulong)uVar11 * 0x18);
      if (pxVar6 != (xmlValidState *)0x0) {
        ctxt->vstateTab = pxVar6;
        ctxt->vstateMax = uVar11;
        iVar4 = ctxt->vstateNr;
        goto LAB_00154086;
      }
    }
    else if (uVar1 < 1000000000) {
      uVar10 = uVar1 + 1 >> 1;
      uVar11 = uVar10 + uVar1;
      if (1000000000 - uVar10 < uVar1) {
        uVar11 = 1000000000;
      }
      goto LAB_00154064;
    }
LAB_001540ed:
    xmlVErrMemory(ctxt);
  }
  return iVar15;
LAB_00153fd6:
  xmlErrValid(pxVar13,XML_DTD_MIXED_CORRUPT,"Internal: MIXED struct corrupted\n",(char *)0x0);
LAB_00153fe9:
  pxVar5 = pxVar6->node;
  pxVar12 = pxVar5->name;
  pcVar8 = "Element %s is not declared in %s list of possible children\n";
  xVar9 = XML_DTD_INVALID_CHILD;
  str1 = qname;
LAB_0015400a:
  xmlErrValidNode(ctxt,pxVar5,xVar9,pcVar8,str1,pxVar12,(xmlChar *)0x0);
switchD_00153e0d_caseD_0:
  iVar15 = 0;
  goto switchD_00153e0d_caseD_2;
}

Assistant:

int
xmlValidatePushElement(xmlValidCtxtPtr ctxt, xmlDocPtr doc,
                       xmlNodePtr elem, const xmlChar *qname) {
    int ret = 1;
    xmlElementPtr eDecl;
    int extsubset = 0;

    if (ctxt == NULL)
        return(0);

    if ((ctxt->vstateNr > 0) && (ctxt->vstate != NULL)) {
	xmlValidStatePtr state = ctxt->vstate;
	xmlElementPtr elemDecl;

	/*
	 * Check the new element against the content model of the new elem.
	 */
	if (state->elemDecl != NULL) {
	    elemDecl = state->elemDecl;

	    switch(elemDecl->etype) {
		case XML_ELEMENT_TYPE_UNDEFINED:
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_EMPTY:
		    xmlErrValidNode(ctxt, state->node,
				    XML_DTD_NOT_EMPTY,
	       "Element %s was declared EMPTY this one has content\n",
			   state->node->name, NULL, NULL);
		    ret = 0;
		    break;
		case XML_ELEMENT_TYPE_ANY:
		    /* I don't think anything is required then */
		    break;
		case XML_ELEMENT_TYPE_MIXED:
		    /* simple case of declared as #PCDATA */
		    if ((elemDecl->content != NULL) &&
			(elemDecl->content->type ==
			 XML_ELEMENT_CONTENT_PCDATA)) {
			xmlErrValidNode(ctxt, state->node,
					XML_DTD_NOT_PCDATA,
	       "Element %s was declared #PCDATA but contains non text nodes\n",
				state->node->name, NULL, NULL);
			ret = 0;
		    } else {
			ret = xmlValidateCheckMixed(ctxt, elemDecl->content,
				                    qname);
			if (ret != 1) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_INVALID_CHILD,
	       "Element %s is not declared in %s list of possible children\n",
				    qname, state->node->name, NULL);
			}
		    }
		    break;
		case XML_ELEMENT_TYPE_ELEMENT:
		    /*
		     * TODO:
		     * VC: Standalone Document Declaration
		     *     - element types with element content, if white space
		     *       occurs directly within any instance of those types.
		     */
		    if (state->exec != NULL) {
			ret = xmlRegExecPushString(state->exec, qname, NULL);
                        if (ret == XML_REGEXP_OUT_OF_MEMORY) {
                            xmlVErrMemory(ctxt);
                            return(0);
                        }
			if (ret < 0) {
			    xmlErrValidNode(ctxt, state->node,
					    XML_DTD_CONTENT_MODEL,
	       "Element %s content does not follow the DTD, Misplaced %s\n",
				   state->node->name, qname, NULL);
			    ret = 0;
			} else {
			    ret = 1;
			}
		    }
		    break;
	    }
	}
    }
    eDecl = xmlValidGetElemDecl(ctxt, doc, elem, &extsubset);
    vstateVPush(ctxt, eDecl, elem);
    return(ret);
}